

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall FConsoleAlias::Realias(FConsoleAlias *this,char *command,bool noSave)

{
  bool bVar1;
  char *pcVar2;
  byte local_19;
  bool noSave_local;
  char *command_local;
  FConsoleAlias *this_local;
  
  local_19 = noSave;
  if (!noSave) {
    bVar1 = FString::IsEmpty(this->m_Command + 1);
    if (!bVar1) {
      local_19 = 1;
    }
  }
  FString::operator=(this->m_Command + (local_19 & 1),command);
  pcVar2 = strchr(command,0x25);
  this->bDoSubstitution = pcVar2 != (char *)0x0;
  this->bKill = false;
  return;
}

Assistant:

void FConsoleAlias::Realias (const char *command, bool noSave)
{
	if (!noSave && !m_Command[1].IsEmpty())
	{
		noSave = true;
	}
	m_Command[noSave] = command;

	// If the command contains % characters, assume they are parameter markers
	// for substitution when the command is executed.
	bDoSubstitution = (strchr (command, '%') != NULL);
	bKill = false;
}